

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<char>::TPZVec(TPZVec<char> *this,initializer_list<char> *list)

{
  ulong uVar1;
  iterator pcVar2;
  char *pcVar3;
  ulong uVar4;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01814070;
  this->fStore = (char *)0x0;
  uVar1 = list->_M_len;
  if (uVar1 != 0) {
    pcVar3 = (char *)operator_new__(uVar1);
    this->fStore = pcVar3;
    pcVar2 = list->_M_array;
    uVar4 = 0;
    do {
      pcVar3[uVar4] = pcVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  this->fNElements = uVar1;
  this->fNAlloc = uVar1;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}